

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-spbset.c
# Opt level: O0

_Bool Curl_uint_spbset_next(uint_spbset *bset,uint last,uint *pnext)

{
  _Bool _Var1;
  uint uVar2;
  uint_spbset_chunk *puStack_30;
  uint last_offset;
  uint_spbset_chunk *chunk;
  uint *pnext_local;
  uint last_local;
  uint_spbset *bset_local;
  
  uVar2 = last + 1 & 0xffffff00;
  for (puStack_30 = &bset->head;
      (puStack_30 != (uint_spbset_chunk *)0x0 && (puStack_30->offset < uVar2));
      puStack_30 = puStack_30->next) {
  }
  if ((puStack_30 != (uint_spbset_chunk *)0x0) && (puStack_30->offset == uVar2)) {
    _Var1 = uint_spbset_chunk_next(puStack_30,last + 1,pnext);
    if (_Var1) {
      return true;
    }
    puStack_30 = puStack_30->next;
  }
  while( true ) {
    if (puStack_30 == (uint_spbset_chunk *)0x0) {
      *pnext = 0xffffffff;
      return false;
    }
    _Var1 = uint_spbset_chunk_first(puStack_30,pnext);
    if (_Var1) break;
    puStack_30 = puStack_30->next;
  }
  return true;
}

Assistant:

bool Curl_uint_spbset_next(struct uint_spbset *bset, unsigned int last,
                           unsigned int *pnext)
{
  struct uint_spbset_chunk *chunk;
  unsigned int last_offset;

  ++last; /* look for the next higher number */
  last_offset = (last & ~CURL_UINT_SPBSET_CH_MASK);

  for(chunk = &bset->head; chunk; chunk = chunk->next) {
    if(chunk->offset >= last_offset) {
      break;
    }
  }

  if(chunk && (chunk->offset == last_offset)) {
    /* is there a number higher than last in this chunk? */
    if(uint_spbset_chunk_next(chunk, last, pnext))
      return TRUE;
    /* not in this chunk */
    chunk = chunk->next;
  }
  /* look for the first in the "higher" chunks, if there are any. */
  while(chunk) {
    if(uint_spbset_chunk_first(chunk, pnext))
      return TRUE;
    chunk = chunk->next;
  }
  *pnext = UINT_MAX;
  return FALSE;
}